

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

Ptr __thiscall MobileElementManager::GetAttached(MobileElementManager *this,int index)

{
  size_type sVar1;
  range_error *this_00;
  reference pvVar2;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Ptr PVar3;
  int index_local;
  MobileElementManager *this_local;
  
  sVar1 = std::
          vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ::size((vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                  *)(CONCAT44(in_register_00000034,index) + 0x28));
  if (sVar1 <= (ulong)(long)in_EDX) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"Polymerase index out of range.");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  pvVar2 = std::
           vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ::operator[]((vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                         *)(CONCAT44(in_register_00000034,index) + 0x28),(long)in_EDX);
  std::shared_ptr<Polymer>::shared_ptr((shared_ptr<Polymer> *)this,&pvVar2->second);
  PVar3.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Polymer::Ptr MobileElementManager::GetAttached(int index) {
  if (index >= polymerases_.size()) {
    throw std::range_error("Polymerase index out of range.");
  }
  return polymerases_[index].second;
}